

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1aacf::IDLExportVisitor::visit_(IDLExportVisitor *this,Compound *type)

{
  string *psVar1;
  ostream *poVar2;
  Indent indenter;
  undefined1 local_78 [40];
  string local_50;
  
  psVar1 = &this->m_indent;
  poVar2 = std::operator<<((ostream *)&this->m_stream,(string *)psVar1);
  poVar2 = std::operator<<(poVar2,"struct ");
  Typelib::Type::getBasename_abi_cxx11_();
  normalizeIDLName((string *)local_78,&local_50);
  poVar2 = std::operator<<(poVar2,(string *)local_78);
  std::operator<<(poVar2," {\n");
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&local_50);
  local_78._0_8_ = psVar1;
  std::__cxx11::string::string((string *)(local_78 + 8),(string *)psVar1);
  std::__cxx11::string::append((char *)local_78._0_8_);
  Typelib::TypeVisitor::visit_((Compound *)this);
  Indent::~Indent((Indent *)local_78);
  poVar2 = std::operator<<((ostream *)&this->m_stream,(string *)psVar1);
  std::operator<<(poVar2,"};\n");
  return true;
}

Assistant:

bool IDLExportVisitor::visit_(Compound const& type)
    {
        m_stream << m_indent << "struct " << normalizeIDLName(type.getBasename()) << " {\n";

        { Indent indenter(m_indent);
            TypeVisitor::visit_(type);
        }

        m_stream << m_indent
            << "};\n";

        return true;
    }